

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.hpp
# Opt level: O2

void __thiscall SplayWeightConfiguration::~SplayWeightConfiguration(SplayWeightConfiguration *this)

{
  if (this->momentSplay[0] != (Splay *)0x0) {
    operator_delete(this->momentSplay[0],0x10);
  }
  if (this->momentSplay[1] != (Splay *)0x0) {
    operator_delete(this->momentSplay[1],0x10);
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&this->cFac);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->fVal).super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->spf).super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->pf).super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->aF).super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->aL).super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->aJ).super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<std::pair<bool,_double>,_std::allocator<std::pair<bool,_double>_>_>::
  ~_Vector_base((_Vector_base<std::pair<bool,_double>,_std::allocator<std::pair<bool,_double>_>_> *)
                this);
  return;
}

Assistant:

~SplayWeightConfiguration() {
        if (momentSplay[0]) {
            delete momentSplay[0];
        }
        if (momentSplay[1]) {
            delete momentSplay[1];
        }
    }